

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LL.cpp
# Opt level: O0

bool __thiscall ll_grammar::GrammarLeft::get_first(GrammarLeft *this,int elemIndex)

{
  int elemIndex_00;
  reference pvVar1;
  size_type sVar2;
  reference pvVar3;
  reference pvVar4;
  int local_50;
  int i_1;
  int local_3c;
  undefined1 local_38 [4];
  int i;
  vector<int,_std::allocator<int>_> temp;
  int elemIndex_local;
  GrammarLeft *this_local;
  
  if (elemIndex == -1) {
    this_local._7_1_ = false;
  }
  else {
    temp.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._4_4_ = elemIndex;
    pvVar1 = std::
             vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ::operator[](&this->first,(long)elemIndex);
    sVar2 = std::vector<int,_std::allocator<int>_>::size(pvVar1);
    if (sVar2 == 0) {
      pvVar3 = std::vector<ll_grammar::ElemLeft,_std::allocator<ll_grammar::ElemLeft>_>::operator[]
                         (&this->elements,
                          (long)temp.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage._4_4_);
      if (((pvVar3->super_Elem).is_finally & 1U) == 0) {
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)local_38);
        std::vector<int,_std::allocator<int>_>::clear(&this->first_temp);
        local_3c = 0;
        while( true ) {
          pvVar3 = std::vector<ll_grammar::ElemLeft,_std::allocator<ll_grammar::ElemLeft>_>::
                   operator[](&this->elements,
                              (long)temp.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_end_of_storage._4_4_);
          sVar2 = std::vector<ll_grammar::ExpressLeft,_std::allocator<ll_grammar::ExpressLeft>_>::
                  size(&pvVar3->expression_of_set);
          if (sVar2 <= (ulong)(long)local_3c) break;
          calculate_expression_first
                    (this,temp.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage._4_4_,local_3c,
                     (vector<int,_std::allocator<int>_> *)local_38,true);
          pvVar1 = std::
                   vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ::operator[](&this->first,
                                (long)temp.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_end_of_storage._4_4_);
          public_tool::connect_vector(pvVar1,(vector<int,_std::allocator<int>_> *)local_38);
          local_3c = local_3c + 1;
        }
        local_50 = 0;
        while( true ) {
          sVar2 = std::vector<int,_std::allocator<int>_>::size(&this->first_temp);
          elemIndex_00 = temp.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage._4_4_;
          if (sVar2 <= (ulong)(long)local_50) break;
          pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                             (&this->first_temp,(long)local_50);
          calculate_expression_first
                    (this,elemIndex_00,*pvVar4,(vector<int,_std::allocator<int>_> *)local_38,false);
          pvVar1 = std::
                   vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ::operator[](&this->first,
                                (long)temp.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_end_of_storage._4_4_);
          public_tool::connect_vector(pvVar1,(vector<int,_std::allocator<int>_> *)local_38);
          local_50 = local_50 + 1;
        }
        std::vector<int,_std::allocator<int>_>::~vector
                  ((vector<int,_std::allocator<int>_> *)local_38);
      }
      else {
        pvVar1 = std::
                 vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ::operator[](&this->first,
                              (long)temp.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_end_of_storage._4_4_);
        std::vector<int,_std::allocator<int>_>::push_back
                  (pvVar1,(value_type *)
                          ((long)&temp.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage + 4));
      }
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool GrammarLeft::get_first(int elemIndex){

    //空串
    if (elemIndex == -1) return false;

    //这个符号的first集合已经求出来了
    if (first[elemIndex].size() != 0) return true;

    //判断是不是终结符，是的话说明这个first可以直接求
    if (elements[elemIndex].is_finally){
        //是终结符,将自己添加就行
        first[elemIndex].push_back(elemIndex);
    }
    else
    {
        //不是终结符，需要计算这个非终结符的每一个表达式然后在添加上去
        //vector<int> t;
        vector<int> temp;
        this->first_temp.clear();//后续准备
        //计算这个产生式的表达式
        for (int i = 0; i < elements[elemIndex].expression_of_set.size(); i++){
            //计算第i个表达式
            calculate_expression_first(elemIndex, i, temp);
            connect_vector(first[elemIndex], temp);
        }
        //对于这种情况有没有可能出现：
        //A->TAb|c|T
        //T->@|t
        //进行递归了
        for (int i = 0; i < first_temp.size(); i++){
            calculate_expression_first(elemIndex, first_temp[i], temp, false);
            connect_vector(first[elemIndex], temp);
        }

    }

    return true;
}